

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::calculate_rapidity_distribution
          (singleParticleSpectra *this,int event_id,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_imag,int flag)

{
  double *pdVar1;
  pointer pvVar2;
  pointer pvVar3;
  long *plVar4;
  pointer pdVar5;
  uint uVar6;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar7;
  long lVar8;
  long lVar9;
  pretty_ostream *this_00;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double __x;
  double dVar17;
  double __y;
  double dVar18;
  string local_50;
  
  iVar11 = this->N_rap;
  if (0 < (long)iVar11) {
    uVar6 = this->order_max;
    pvVar2 = (event_Qn_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (event_Qn_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      if (0 < (int)uVar6) {
        lVar8 = *(long *)&pvVar2[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        lVar9 = *(long *)&pvVar3[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        uVar13 = 0;
        do {
          *(undefined8 *)(lVar8 + uVar13 * 8) = 0;
          *(undefined8 *)(lVar9 + uVar13 * 8) = 0;
          uVar13 = uVar13 + 1;
        } while (uVar6 != uVar13);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar11);
  }
  if (2 < (uint)flag) {
    this_00 = &this->messager;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"calculate_rapidity_distribution: ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"unrecogonized flag = ",0x15);
    std::ostream::operator<<(this_00,flag);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"error","");
    pretty_ostream::flush(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    exit(1);
  }
  lVar10 = (long)event_id;
  plVar4 = *(long **)(**(long **)((long)&(((this->particle_list).
                                           super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->paraRdr_).names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data +
                                 *(long *)(&DAT_0014fc68 + (ulong)(uint)flag * 8)) + lVar10 * 8);
  uVar6 = (int)(plVar4[1] - *plVar4 >> 3) * -0x11111111;
  if (0 < (int)uVar6) {
    uVar13 = 0;
    do {
      if (flag == 2) {
        pvVar7 = ((this->particle_list).
                  super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 negative_charge_hadron_list;
LAB_00127dd6:
        lVar8 = *(long *)&(pvVar7->
                          super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar10]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>;
        lVar9 = uVar13 * 0x78;
        pdVar1 = (double *)(lVar8 + 0x28 + lVar9);
        dVar17 = *pdVar1;
        dVar18 = pdVar1[1];
        dVar16 = *(double *)(lVar8 + 8 + lVar9);
        iVar11 = *(int *)(lVar8 + 0x10 + lVar9);
      }
      else {
        if (flag == 1) {
          pvVar7 = ((this->particle_list).
                    super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   positive_charge_hadron_list;
          goto LAB_00127dd6;
        }
        dVar17 = 0.0;
        dVar18 = 0.0;
        dVar16 = 0.0;
        iVar11 = 0;
        if (flag == 0) {
          lVar8 = *(long *)&(((this->particle_list).
                              super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->particle_list->
                            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[lVar10]->
                            super__Vector_base<particle_info,_std::allocator<particle_info>_>;
          lVar9 = uVar13 * 0x78;
          dVar16 = *(double *)(lVar8 + 8 + lVar9);
          iVar11 = *(int *)(lVar8 + 0x10 + lVar9);
          pdVar1 = (double *)(lVar8 + 0x28 + lVar9);
          dVar17 = *pdVar1;
          dVar18 = pdVar1[1];
        }
      }
      dVar14 = dVar18 * dVar18 - dVar16 * dVar16;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      dVar15 = dVar14;
      if (this->rap_type != 0) {
        dVar15 = dVar18;
      }
      dVar15 = log((dVar17 + dVar15) / (dVar15 - dVar17));
      dVar15 = dVar15 * 0.5;
      if (((this->rapidity_dis_min - this->drap * 0.5 <= dVar15) &&
          (uVar12 = (uint)((dVar15 - this->rapidity_dis_min) / this->drap + 0.5), -1 < (int)uVar12))
         && ((int)uVar12 < this->N_rap)) {
        if (flag == 2) {
          lVar8 = 0x6d8;
LAB_00127fa7:
          lVar8 = **(long **)(**(long **)((long)&(((this->particle_list).
                                                                                                      
                                                  super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->paraRdr_).names.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + lVar8) +
                             lVar10 * 8);
          __x = *(double *)(lVar8 + 0x18 + uVar13 * 0x78);
          __y = *(double *)(lVar8 + 0x20 + uVar13 * 0x78);
        }
        else {
          if (flag == 1) {
            lVar8 = 0x6d0;
            goto LAB_00127fa7;
          }
          __x = 0.0;
          __y = 0.0;
          if (flag == 0) {
            pdVar5 = (this->rapidity_array).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar5[uVar12] = dVar15 + pdVar5[uVar12];
            pdVar5 = (this->dNdy_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5[uVar12] = pdVar5[uVar12] + 1.0;
            dVar17 = 1.0 - (dVar17 * dVar17) / (dVar14 * dVar14);
            if (dVar17 < 0.0) {
              dVar17 = sqrt(dVar17);
            }
            else {
              dVar17 = SQRT(dVar17);
            }
            if (iVar11 == -1) {
              dVar18 = dVar18 + dVar16;
            }
            else if (iVar11 == 1) {
              dVar18 = dVar18 - dVar16;
            }
            pdVar5 = (this->dETdy_array).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            pdVar5[uVar12] = dVar18 * dVar17 + pdVar5[uVar12];
            lVar8 = 0x6a0;
            goto LAB_00127fa7;
          }
        }
        dVar16 = SQRT(__x * __x + __y * __y);
        if ((this->vn_rapidity_dis_pT_min <= dVar16 && dVar16 != this->vn_rapidity_dis_pT_min) &&
           (dVar16 < this->vn_rapidity_dis_pT_max)) {
          dVar17 = atan2(__y,__x);
          pdVar1 = (event_Qn_real->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *pdVar1 = *pdVar1 + 1.0;
          pdVar1 = (event_Qn_imag->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *pdVar1 = dVar16 + *pdVar1;
          if (1 < this->order_max) {
            lVar8 = 1;
            do {
              dVar18 = (double)(int)lVar8 * dVar17;
              dVar16 = cos(dVar18);
              dVar18 = sin(dVar18);
              lVar9 = *(long *)&(event_Qn_real->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data;
              *(double *)(lVar9 + lVar8 * 8) = dVar16 + *(double *)(lVar9 + lVar8 * 8);
              lVar9 = *(long *)&(event_Qn_imag->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data;
              *(double *)(lVar9 + lVar8 * 8) = dVar18 + *(double *)(lVar9 + lVar8 * 8);
              lVar8 = lVar8 + 1;
            } while (lVar8 < this->order_max);
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar6 & 0x7fffffff));
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_rapidity_distribution(
    int event_id, vector<vector<double>> &event_Qn_real,
    vector<vector<double>> &event_Qn_imag, int flag) {
    // first clean the results arrays
    for (int i = 0; i < N_rap; i++) {
        for (int j = 0; j < order_max; j++) {
            event_Qn_real[i][j] = 0.0;
            event_Qn_imag[i][j] = 0.0;
        }
    }

    int number_of_particles = 0;
    if (flag == 0) {
        number_of_particles = particle_list->get_number_of_particles(event_id);
    } else if (flag == 1) {
        number_of_particles =
            (particle_list->get_number_of_positive_particles(event_id));
    } else if (flag == 2) {
        number_of_particles =
            (particle_list->get_number_of_negative_particles(event_id));
    } else {
        messager << "calculate_rapidity_distribution: "
                 << "unrecogonized flag = " << flag;
        messager.flush("error");
        exit(1);
    }
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = 0.0;
        double E_local = 0.0;
        double mass = 0.0;
        int baryon = 0;
        if (flag == 0) {
            auto particle_local = particle_list->get_particle(event_id, i);
            pz_local = particle_local.pz;
            E_local = particle_local.E;
            mass = particle_local.mass;
            baryon = particle_local.baryon;
        } else if (flag == 1) {
            pz_local = particle_list->get_positive_particle(event_id, i).pz;
            E_local = particle_list->get_positive_particle(event_id, i).E;
            mass = particle_list->get_positive_particle(event_id, i).mass;
            baryon = particle_list->get_positive_particle(event_id, i).baryon;
        } else if (flag == 2) {
            pz_local = particle_list->get_negative_particle(event_id, i).pz;
            E_local = particle_list->get_negative_particle(event_id, i).E;
            mass = particle_list->get_negative_particle(event_id, i).mass;
            baryon = particle_list->get_negative_particle(event_id, i).baryon;
        }
        double pmag = sqrt(E_local * E_local - mass * mass);

        double rap_local = 0.0;
        if (rap_type == 0) {
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local < rapidity_dis_min - drap / 2.) continue;

        int rap_idx =
            static_cast<int>((rap_local - rapidity_dis_min) / drap + 0.5);
        if (rap_idx < 0 || rap_idx >= N_rap) continue;

        // no pT cut on particle yield
        if (flag == 0) {
            rapidity_array[rap_idx] += rap_local;
            dNdy_array[rap_idx]++;

            // compute the transverse energy
            // ALICE https://arxiv.org/pdf/1603.04775
            // PHENIX https://arxiv.org/pdf/nucl-ex/0409015
            double sin_theta = sqrt(1. - pz_local * pz_local / (pmag * pmag));
            if (baryon == 1) {
                dETdy_array[rap_idx] += (E_local - mass) * sin_theta;
            } else if (baryon == -1) {
                dETdy_array[rap_idx] += (E_local + mass) * sin_theta;
            } else {
                dETdy_array[rap_idx] += E_local * sin_theta;
            }
        }
        // calcualte vn
        double px_local = 0.0;
        double py_local = 0.0;
        if (flag == 0) {
            px_local = particle_list->get_particle(event_id, i).px;
            py_local = particle_list->get_particle(event_id, i).py;
        } else if (flag == 1) {
            px_local = particle_list->get_positive_particle(event_id, i).px;
            py_local = particle_list->get_positive_particle(event_id, i).py;
        } else if (flag == 2) {
            px_local = particle_list->get_negative_particle(event_id, i).px;
            py_local = particle_list->get_negative_particle(event_id, i).py;
        }
        double p_perp = sqrt(px_local * px_local + py_local * py_local);
        if (p_perp > vn_rapidity_dis_pT_min
            && p_perp < vn_rapidity_dis_pT_max) {
            double p_phi = atan2(py_local, px_local);
            event_Qn_real[rap_idx][0] += 1.;
            event_Qn_imag[rap_idx][0] += p_perp;  // record mean pT
            for (int iorder = 1; iorder < order_max; iorder++) {
                double cos_nphi = cos(iorder * p_phi);
                double sin_nphi = sin(iorder * p_phi);
                event_Qn_real[rap_idx][iorder] += cos_nphi;
                event_Qn_imag[rap_idx][iorder] += sin_nphi;
            }
        }
    }
}